

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O1

int gray_convert_glyph(gray_PWorker worker)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  size_t __n;
  int iVar11;
  PCell_conflict pTVar12;
  uchar uVar13;
  int iVar14;
  long lVar15;
  uchar *__s;
  uint uVar16;
  uchar *puVar17;
  uint uVar18;
  uint uVar19;
  FT_Span span [16];
  TCoord bands [32];
  TCell buffer [682];
  int local_411c;
  FT_Span local_4108 [16];
  int local_40a8;
  int local_40a4;
  TCell_ local_4028 [681];
  TCell_ local_50;
  
  local_40a4 = worker->min_ey;
  iVar1 = worker->max_ey;
  uVar2 = iVar1 - local_40a4;
  worker->cell_null = &local_50;
  local_50.x = 0x7fffffff;
  local_50.cover = 0;
  local_50.area = 0;
  local_50.next = (PCell)0x0;
  worker->ycells = (PCell_conflict *)local_4028;
  if (0x55 < uVar2) {
    uVar8 = ((long)(int)uVar2 + 0x54U) / 0x55;
    uVar2 = (uint)((((long)(int)uVar2 + uVar8) - 1) / uVar8);
  }
  if (local_40a4 < iVar1) {
    iVar3 = 0;
    do {
      piVar4 = &local_40a8;
      worker->min_ey = local_40a4;
      iVar9 = local_40a4 + uVar2;
      local_40a8 = iVar1;
      if (iVar9 < iVar1) {
        local_40a8 = iVar9;
      }
      worker->max_ey = local_40a8;
      do {
        iVar6 = piVar4[1];
        uVar8 = (long)*piVar4 - (long)iVar6;
        uVar18 = (uint)uVar8;
        if (0 < (int)uVar18) {
          uVar10 = 0;
          do {
            worker->ycells[uVar10] = worker->cell_null;
            uVar10 = uVar10 + 1;
          } while ((uVar8 & 0xffffffff) != uVar10);
        }
        worker->cell_free = local_4028 + (uVar8 * 8 + 0x17) / 0x18;
        worker->cell = worker->cell_null;
        worker->min_ey = iVar6;
        worker->max_ey = *piVar4;
        worker->count_ey = uVar18;
        iVar3 = gray_convert_glyph_inner(worker,iVar3);
        iVar6 = 1;
        if (iVar3 == 0x62) {
          if (uVar18 < 2) {
            local_411c = 0x62;
            iVar3 = local_411c;
          }
          else {
            piVar4[2] = piVar4[1];
            piVar4[1] = ((int)uVar18 >> 1) + piVar4[1];
            piVar4 = piVar4 + 1;
            iVar6 = 0;
            iVar3 = local_411c;
          }
        }
        else if (iVar3 == 0) {
          if (worker->render_span == (FT_SpanFunc)0x0) {
            iVar3 = worker->min_ey;
            uVar18 = (worker->outline).flags;
            uVar19 = 0x100;
            if ((uVar18 & 2) == 0) {
              uVar19 = 0x80000000;
            }
            if (iVar3 < worker->max_ey) {
              do {
                iVar6 = worker->min_ex;
                puVar17 = (worker->target).origin;
                lVar15 = (long)(worker->target).pitch * (long)iVar3;
                pTVar12 = worker->ycells[(long)iVar3 - (long)worker->min_ey];
                if (pTVar12 == worker->cell_null) {
                  iVar11 = 0;
                }
                else {
                  iVar11 = 0;
                  do {
                    if ((iVar11 != 0) &&
                       (iVar14 = pTVar12->x - iVar6, iVar14 != 0 && iVar6 <= pTVar12->x)) {
                      uVar16 = -(uint)((iVar11 >> 9 & uVar19) != 0) ^ iVar11 >> 9;
                      uVar7 = uVar16;
                      if ((uVar18 & 2) == 0) {
                        uVar7 = 0xff;
                      }
                      if ((int)uVar16 < 0x100) {
                        uVar7 = uVar16;
                      }
                      __s = puVar17 + (iVar6 - lVar15);
                      uVar13 = (uchar)uVar7;
                      switch(iVar14) {
                      case 0:
                        break;
                      case 7:
                        *__s = uVar13;
                        __s = __s + 1;
                      case 6:
                        *__s = uVar13;
                        __s = __s + 1;
                      case 5:
                        *__s = uVar13;
                        __s = __s + 1;
                      case 4:
                        *__s = uVar13;
                        __s = __s + 1;
                      case 3:
                        *__s = uVar13;
                        __s = __s + 1;
                      case 2:
                        *__s = uVar13;
                        __s = __s + 1;
                      case 1:
                        *__s = uVar13;
                        break;
                      default:
                        memset(__s,uVar7,(long)iVar14);
                      }
                    }
                    iVar11 = pTVar12->cover * 0x200 + iVar11;
                    iVar6 = iVar11 - pTVar12->area;
                    if ((iVar6 != 0) && (worker->min_ex <= pTVar12->x)) {
                      uVar16 = iVar6 >> 9;
                      uVar16 = -(uint)((uVar16 & uVar19) != 0) ^ uVar16;
                      uVar7 = (uint)(byte)(-((uVar18 & 2) == 0) | (byte)uVar16);
                      if ((int)uVar16 < 0x100) {
                        uVar7 = uVar16;
                      }
                      puVar17[pTVar12->x - lVar15] = (uchar)uVar7;
                    }
                    iVar6 = pTVar12->x + 1;
                    pTVar12 = pTVar12->next;
                  } while (pTVar12 != worker->cell_null);
                }
                if (iVar11 != 0) {
                  uVar16 = -(uint)((iVar11 >> 9 & uVar19) != 0) ^ iVar11 >> 9;
                  uVar7 = uVar16;
                  if ((uVar18 & 2) == 0) {
                    uVar7 = 0xff;
                  }
                  if ((int)uVar16 < 0x100) {
                    uVar7 = uVar16;
                  }
                  puVar17 = puVar17 + (iVar6 - lVar15);
                  __n = (long)worker->max_ex - (long)iVar6;
                  uVar13 = (uchar)uVar7;
                  switch(__n & 0xffffffff) {
                  case 0:
                    break;
                  case 7:
                    *puVar17 = uVar13;
                    puVar17 = puVar17 + 1;
                  case 6:
                    *puVar17 = uVar13;
                    puVar17 = puVar17 + 1;
                  case 5:
                    *puVar17 = uVar13;
                    puVar17 = puVar17 + 1;
                  case 4:
                    *puVar17 = uVar13;
                    puVar17 = puVar17 + 1;
                  case 3:
                    *puVar17 = uVar13;
                    puVar17 = puVar17 + 1;
                  case 2:
                    *puVar17 = uVar13;
                    puVar17 = puVar17 + 1;
                  case 1:
                    *puVar17 = uVar13;
                    break;
                  default:
                    memset(puVar17,uVar7,__n);
                  }
                }
                iVar3 = iVar3 + 1;
              } while (iVar3 < worker->max_ey);
            }
          }
          else {
            uVar18 = (worker->outline).flags;
            uVar19 = 0x100;
            if ((uVar18 & 2) == 0) {
              uVar19 = 0x80000000;
            }
            iVar3 = worker->min_ey;
            if (iVar3 < worker->max_ey) {
              do {
                iVar6 = worker->min_ex;
                pTVar12 = worker->ycells[(long)iVar3 - (long)worker->min_ey];
                if (pTVar12 == worker->cell_null) {
                  iVar14 = 0;
                  iVar11 = 0;
                }
                else {
                  iVar11 = 0;
                  iVar14 = 0;
                  do {
                    if ((iVar11 != 0) &&
                       (iVar5 = pTVar12->x - iVar6, iVar5 != 0 && iVar6 <= pTVar12->x)) {
                      uVar16 = -(uint)((iVar11 >> 9 & uVar19) != 0) ^ iVar11 >> 9;
                      uVar7 = (uint)(byte)(-((uVar18 & 2) == 0) | (byte)uVar16);
                      if ((int)uVar16 < 0x100) {
                        uVar7 = uVar16;
                      }
                      local_4108[iVar14].coverage = (uchar)uVar7;
                      local_4108[iVar14].x = (short)iVar6;
                      local_4108[iVar14].len = (unsigned_short)iVar5;
                      iVar14 = iVar14 + 1;
                      if (iVar14 == 0x10) {
                        (*worker->render_span)(iVar3,0x10,local_4108,worker->render_span_data);
                        iVar14 = 0;
                      }
                    }
                    iVar11 = pTVar12->cover * 0x200 + iVar11;
                    iVar6 = iVar11 - pTVar12->area;
                    if ((iVar6 != 0) && (iVar5 = pTVar12->x, worker->min_ex <= iVar5)) {
                      uVar16 = iVar6 >> 9;
                      uVar16 = -(uint)((uVar16 & uVar19) != 0) ^ uVar16;
                      uVar7 = (uint)(byte)(-((uVar18 & 2) == 0) | (byte)uVar16);
                      if ((int)uVar16 < 0x100) {
                        uVar7 = uVar16;
                      }
                      local_4108[iVar14].coverage = (uchar)uVar7;
                      local_4108[iVar14].x = (short)iVar5;
                      local_4108[iVar14].len = 1;
                      iVar14 = iVar14 + 1;
                      if (iVar14 == 0x10) {
                        (*worker->render_span)(iVar3,0x10,local_4108,worker->render_span_data);
                        iVar14 = 0;
                      }
                    }
                    iVar6 = pTVar12->x + 1;
                    pTVar12 = pTVar12->next;
                  } while (pTVar12 != worker->cell_null);
                }
                if (iVar11 != 0) {
                  uVar16 = -(uint)((iVar11 >> 9 & uVar19) != 0) ^ iVar11 >> 9;
                  uVar7 = (uint)(byte)(-((uVar18 & 2) == 0) | (byte)uVar16);
                  if ((int)uVar16 < 0x100) {
                    uVar7 = uVar16;
                  }
                  local_4108[iVar14].coverage = (uchar)uVar7;
                  local_4108[iVar14].x = (short)iVar6;
                  local_4108[iVar14].len = (short)worker->max_ex - (short)iVar6;
                  iVar14 = iVar14 + 1;
                }
                if (iVar14 != 0) {
                  (*worker->render_span)(iVar3,iVar14,local_4108,worker->render_span_data);
                }
                iVar3 = iVar3 + 1;
              } while (iVar3 < worker->max_ey);
            }
          }
          piVar4 = piVar4 + -1;
          iVar6 = 5;
          iVar3 = local_411c;
        }
        local_411c = iVar3;
        if ((iVar6 != 5) && (iVar6 != 0)) {
          return local_411c;
        }
        iVar3 = 1;
      } while (&local_40a8 <= piVar4);
      iVar3 = 1;
      local_40a4 = iVar9;
    } while (iVar9 < iVar1);
  }
  return 0;
}

Assistant:

static int
  gray_convert_glyph( RAS_ARG )
  {
    const TCoord  yMin = ras.min_ey;
    const TCoord  yMax = ras.max_ey;

    TCell    buffer[FT_MAX_GRAY_POOL];
    size_t   height = (size_t)( yMax - yMin );
    size_t   n = FT_MAX_GRAY_POOL / 8;
    TCoord   y;
    TCoord   bands[32];  /* enough to accommodate bisections */
    TCoord*  band;

    int  continued = 0;


    /* Initialize the null cell at the end of the poll. */
    ras.cell_null        = buffer + FT_MAX_GRAY_POOL - 1;
    ras.cell_null->x     = CELL_MAX_X_VALUE;
    ras.cell_null->area  = 0;
    ras.cell_null->cover = 0;
    ras.cell_null->next  = NULL;

    /* set up vertical bands */
    ras.ycells     = (PCell*)buffer;

    if ( height > n )
    {
      /* two divisions rounded up */
      n       = ( height + n - 1 ) / n;
      height  = ( height + n - 1 ) / n;
    }

    for ( y = yMin; y < yMax; )
    {
      ras.min_ey = y;
      y         += height;
      ras.max_ey = FT_MIN( y, yMax );

      band    = bands;
      band[1] = ras.min_ey;
      band[0] = ras.max_ey;

      do
      {
        TCoord  width = band[0] - band[1];
        TCoord  w;
        int     error;


        for ( w = 0; w < width; ++w )
          ras.ycells[w] = ras.cell_null;

        /* memory management: skip ycells */
        n = ( (size_t)width * sizeof ( PCell ) + sizeof ( TCell ) - 1 ) /
              sizeof ( TCell );

        ras.cell_free = buffer + n;
        ras.cell      = ras.cell_null;
        ras.min_ey    = band[1];
        ras.max_ey    = band[0];
        ras.count_ey  = width;

        error     = gray_convert_glyph_inner( RAS_VAR_ continued );
        continued = 1;

        if ( !error )
        {
          if ( ras.render_span )  /* for FT_RASTER_FLAG_DIRECT only */
            gray_sweep_direct( RAS_VAR );
          else
            gray_sweep( RAS_VAR );
          band--;
          continue;
        }
        else if ( error != Smooth_Err_Raster_Overflow )
          return error;

        /* render pool overflow; we will reduce the render band by half */
        width >>= 1;

        /* this should never happen even with tiny rendering pool */
        if ( width == 0 )
        {
          FT_TRACE7(( "gray_convert_glyph: rotten glyph\n" ));
          return FT_THROW( Raster_Overflow );
        }

        band++;
        band[1]  = band[0];
        band[0] += width;
      } while ( band >= bands );
    }

    return Smooth_Err_Ok;
  }